

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::IfdefGuardPrinter::~IfdefGuardPrinter(IfdefGuardPrinter *this)

{
  Printer *this_00;
  Arg *in_R8;
  string_view format;
  Arg local_80;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  string_view local_20;
  IfdefGuardPrinter *local_10;
  IfdefGuardPrinter *this_local;
  
  this_00 = this->p_;
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"\n#endif  // $0\n");
  absl::lts_20240722::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_80,&this->ifdef_identifier_);
  format._M_str = (char *)&local_80;
  format._M_len = (size_t)local_50._M_str;
  absl::lts_20240722::Substitute_abi_cxx11_(&local_40,(lts_20240722 *)local_50._M_len,format,in_R8);
  local_20 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_40);
  io::Printer::Print<>(this_00,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&this->ifdef_identifier_);
  return;
}

Assistant:

IfdefGuardPrinter::~IfdefGuardPrinter() {
  // We can't use variable substitution, because we don't know what delimiter
  // to use.
  p_->Print(absl::Substitute(
      R"(
#endif  // $0
)",
      ifdef_identifier_));
}